

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsWindowsPELinker.cxx
# Opt level: O2

bool __thiscall cmBinUtilsWindowsPELinker::Prepare(cmBinUtilsWindowsPELinker *this)

{
  cmRuntimeDependencyArchive *this_00;
  cmBinUtilsWindowsPEGetRuntimeDependenciesTool *pcVar1;
  _func_int **pp_Var2;
  bool bVar3;
  ostream *poVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  string tool;
  ostringstream e;
  allocator<char> local_1e9;
  string local_1e8;
  string local_1c0;
  ostream local_1a0;
  
  cmRuntimeDependencyArchive::GetGetRuntimeDependenciesTool_abi_cxx11_
            (&local_1c0,(this->super_cmBinUtilsLinker).Archive);
  if (local_1c0._M_string_length == 0) {
    local_1e8._M_dataplus._M_p = (pointer)0x0;
    local_1e8._M_string_length = 0;
    local_1e8.field_2._M_allocated_capacity = 0;
    this_00 = (this->super_cmBinUtilsLinker).Archive;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"dumpbin",&local_1e9);
    cmRuntimeDependencyArchive::GetGetRuntimeDependenciesCommand
              (this_00,(string *)&local_1a0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::assign((char *)&local_1c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1e8);
  }
  bVar3 = std::operator==(&local_1c0,"dumpbin");
  if (bVar3) {
    std::
    make_unique<cmBinUtilsWindowsPEDumpbinGetRuntimeDependenciesTool,cmRuntimeDependencyArchive*&>
              ((cmRuntimeDependencyArchive **)&local_1a0);
  }
  else {
    bVar3 = std::operator==(&local_1c0,"objdump");
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
      poVar4 = std::operator<<(&local_1a0,"Invalid value for CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL: ")
      ;
      std::operator<<(poVar4,(string *)&local_1c0);
      std::__cxx11::stringbuf::str();
      cmBinUtilsLinker::SetError(&this->super_cmBinUtilsLinker,&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
      bVar3 = false;
      goto LAB_002d61d8;
    }
    std::
    make_unique<cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool,cmRuntimeDependencyArchive*&>
              ((cmRuntimeDependencyArchive **)&local_1a0);
  }
  pp_Var2 = local_1a0._vptr_basic_ostream;
  local_1a0._vptr_basic_ostream = (_func_int **)0x0;
  pcVar1 = (this->Tool)._M_t.
           super___uniq_ptr_impl<cmBinUtilsWindowsPEGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsWindowsPEGetRuntimeDependenciesTool>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmBinUtilsWindowsPEGetRuntimeDependenciesTool_*,_std::default_delete<cmBinUtilsWindowsPEGetRuntimeDependenciesTool>_>
           .super__Head_base<0UL,_cmBinUtilsWindowsPEGetRuntimeDependenciesTool_*,_false>.
           _M_head_impl;
  (this->Tool)._M_t.
  super___uniq_ptr_impl<cmBinUtilsWindowsPEGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsWindowsPEGetRuntimeDependenciesTool>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmBinUtilsWindowsPEGetRuntimeDependenciesTool_*,_std::default_delete<cmBinUtilsWindowsPEGetRuntimeDependenciesTool>_>
  .super__Head_base<0UL,_cmBinUtilsWindowsPEGetRuntimeDependenciesTool_*,_false>._M_head_impl =
       (cmBinUtilsWindowsPEGetRuntimeDependenciesTool *)pp_Var2;
  if ((pcVar1 != (cmBinUtilsWindowsPEGetRuntimeDependenciesTool *)0x0) &&
     ((*pcVar1->_vptr_cmBinUtilsWindowsPEGetRuntimeDependenciesTool[1])(),
     (cmBinUtilsWindowsPEGetRuntimeDependenciesTool *)local_1a0._vptr_basic_ostream !=
     (cmBinUtilsWindowsPEGetRuntimeDependenciesTool *)0x0)) {
    (**(code **)((long)*local_1a0._vptr_basic_ostream + 8))();
  }
  bVar3 = true;
LAB_002d61d8:
  std::__cxx11::string::~string((string *)&local_1c0);
  return bVar3;
}

Assistant:

bool cmBinUtilsWindowsPELinker::Prepare()
{
  std::string tool = this->Archive->GetGetRuntimeDependenciesTool();
  if (tool.empty()) {
    std::vector<std::string> command;
    if (this->Archive->GetGetRuntimeDependenciesCommand("dumpbin", command)) {
      tool = "dumpbin";
    } else {
      tool = "objdump";
    }
  }
  if (tool == "dumpbin") {
    this->Tool =
      cm::make_unique<cmBinUtilsWindowsPEDumpbinGetRuntimeDependenciesTool>(
        this->Archive);
  } else if (tool == "objdump") {
    this->Tool =
      cm::make_unique<cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool>(
        this->Archive);
  } else {
    std::ostringstream e;
    e << "Invalid value for CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL: " << tool;
    this->SetError(e.str());
    return false;
  }

  return true;
}